

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

CheckStreamRez * __thiscall
HEVCStreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,HEVCStreamReader *this,uint8_t *buffer,int len)

{
  bool bVar1;
  int iVar2;
  HevcVpsUnit *this_00;
  HevcSpsUnit *this_01;
  HevcPpsUnit *this_02;
  byte *local_1a8;
  string local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  long local_80;
  size_t frSpsPos;
  byte *local_58;
  uint8_t *nextNal;
  NalType nalType;
  byte *local_38;
  uint8_t *nal;
  uint8_t *end;
  uint8_t *puStack_20;
  int len_local;
  uint8_t *buffer_local;
  HEVCStreamReader *this_local;
  CheckStreamRez *rez;
  
  end._3_1_ = 0;
  end._4_4_ = len;
  puStack_20 = buffer;
  buffer_local = (uint8_t *)this;
  this_local = (HEVCStreamReader *)__return_storage_ptr__;
  CheckStreamRez::CheckStreamRez(__return_storage_ptr__);
  nal = puStack_20 + end._4_4_;
  for (local_38 = NALUnit::findNextNAL(puStack_20,nal); local_38 < nal + -4;
      local_38 = NALUnit::findNextNAL(local_38,nal)) {
    if ((*local_38 & 0x80) != 0) {
      return __return_storage_ptr__;
    }
    nextNal._4_4_ = *local_38 >> 1 & DVEL;
    local_58 = NALUnit::findNALWithStartCode(local_38,nal,true);
    if ((((this->super_MPEGStreamReader).m_eof & 1U) == 0) && (local_58 == nal)) break;
    switch(nextNal._4_4_) {
    case VPS:
      if (this->m_vps == (HevcVpsUnit *)0x0) {
        this_00 = (HevcVpsUnit *)operator_new(0x50);
        HevcVpsUnit::HevcVpsUnit(this_00);
        this->m_vps = this_00;
      }
      HevcUnit::decodeBuffer((HevcUnit *)this->m_vps,local_38,local_58);
      iVar2 = HevcVpsUnit::deserialize(this->m_vps);
      if (iVar2 != 0) {
        return __return_storage_ptr__;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      if (this->m_vps->num_units_in_tick != 0) {
        MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_vps,local_38,local_58,0);
      }
      break;
    case SPS:
      if (this->m_sps == (HevcSpsUnit *)0x0) {
        this_01 = (HevcSpsUnit *)operator_new(0xa0);
        HevcSpsUnit::HevcSpsUnit(this_01);
        this->m_sps = this_01;
      }
      HevcUnit::decodeBuffer((HevcUnit *)this->m_sps,local_38,local_58);
      iVar2 = HevcSpsUnit::deserialize(this->m_sps);
      if (iVar2 != 0) {
        return __return_storage_ptr__;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_sps,local_38,local_58,0);
      break;
    case PPS:
      if (this->m_pps == (HevcPpsUnit *)0x0) {
        this_02 = (HevcPpsUnit *)operator_new(0x48);
        HevcPpsUnit::HevcPpsUnit(this_02);
        this->m_pps = this_02;
      }
      HevcUnit::decodeBuffer(&this->m_pps->super_HevcUnit,local_38,local_58);
      iVar2 = HevcPpsUnit::deserialize(this->m_pps);
      goto joined_r0x002a9ff7;
    default:
      break;
    case SEI_PREFIX:
      HevcUnit::decodeBuffer(&this->m_hdr->super_HevcUnit,local_38,local_58);
      iVar2 = HevcHdrUnit::deserialize(this->m_hdr);
joined_r0x002a9ff7:
      if (iVar2 != 0) {
        return __return_storage_ptr__;
      }
      break;
    case DVRPU:
    case DVEL:
      if (local_38[1] == 1) {
        if (nextNal._4_4_ == DVEL) {
          this->m_hdr->isDVEL = true;
        }
        else {
          this->m_hdr->isDVRPU = true;
        }
        V3_flags = V3_flags | 4;
      }
    }
    bVar1 = isSlice(this,nextNal._4_4_);
    if ((bVar1) && ((local_38[2] & 0x80) != 0)) {
      if (local_58 < local_38 + 0x40) {
        local_1a8 = local_58;
      }
      else {
        local_1a8 = local_38 + 0x40;
      }
      HevcUnit::decodeBuffer(&this->m_slice->super_HevcUnit,local_38,local_1a8);
      iVar2 = HevcSliceHeader::deserialize(this->m_slice,this->m_sps,this->m_pps);
      if (iVar2 != 0) {
        return __return_storage_ptr__;
      }
      iVar2 = toFullPicOrder(this,this->m_slice,this->m_sps->log2_max_pic_order_cnt_lsb);
      this->m_fullPicOrder = iVar2;
      incTimings(this);
    }
  }
  this->m_fullPicOrder = 0;
  this->m_frameNum = 0;
  (this->super_MPEGStreamReader).m_totalFrameNum = 0;
  (this->super_MPEGStreamReader).m_curPts = 0;
  (this->super_MPEGStreamReader).m_curDts = 0;
  if ((((this->m_vps != (HevcVpsUnit *)0x0) && (this->m_sps != (HevcSpsUnit *)0x0)) &&
      (this->m_pps != (HevcPpsUnit *)0x0)) &&
     (((uint)(byte)(this->m_sps->super_HevcUnitWithProfile).field_0x3b ==
       *(uint *)&(this->m_vps->super_HevcUnitWithProfile).field_0x3c &&
      (this->m_pps->sps_id == this->m_sps->sps_id)))) {
    if ((this->m_sps->colour_primaries == '\t') &&
       ((this->m_sps->transfer_characteristics == '\x10' && (this->m_sps->matrix_coeffs == '\t'))))
    {
      this->m_hdr->isHDR10 = true;
      V3_flags = V3_flags | 2;
    }
    CodecInfo::operator=(&__return_storage_ptr__->codecInfo,&::hevcCodecInfo);
    HevcSpsUnit::getDescription_abi_cxx11_((string *)&frSpsPos,this->m_sps);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->streamDescr,(string *)&frSpsPos);
    std::__cxx11::string::~string((string *)&frSpsPos);
    local_80 = std::__cxx11::string::find((char *)&__return_storage_ptr__->streamDescr,0x3b3b03);
    if (local_80 != -1) {
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)&__return_storage_ptr__->streamDescr);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_100," ",&local_101);
      std::operator+(&local_c0,&local_e0,&local_100);
      HevcVpsUnit::getDescription_abi_cxx11_(&local_128,this->m_vps);
      std::operator+(&local_a0,&local_c0,&local_128);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->streamDescr,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::__cxx11::string::~string((string *)&local_e0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez HEVCStreamReader::checkStream(uint8_t* buffer, const int len)
{
    CheckStreamRez rez;

    uint8_t* end = buffer + len;
    for (uint8_t* nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;  // invalid nal
        const auto nalType = static_cast<HevcUnit::NalType>((*nal >> 1) & 0x3f);
        uint8_t* nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case HevcUnit::NalType::VPS:
            if (!m_vps)
                m_vps = new HevcVpsUnit();
            m_vps->decodeBuffer(nal, nextNal);
            if (m_vps->deserialize() != 0)
                return rez;
            m_spsPpsFound = true;
            if (m_vps->num_units_in_tick)
                updateFPS(m_vps, nal, nextNal, 0);
            break;
        case HevcUnit::NalType::SPS:
            if (!m_sps)
                m_sps = new HevcSpsUnit();
            m_sps->decodeBuffer(nal, nextNal);
            if (m_sps->deserialize() != 0)
                return rez;
            m_spsPpsFound = true;
            updateFPS(m_sps, nal, nextNal, 0);
            break;
        case HevcUnit::NalType::PPS:
            if (!m_pps)
                m_pps = new HevcPpsUnit();
            m_pps->decodeBuffer(nal, nextNal);
            if (m_pps->deserialize() != 0)
                return rez;
            break;
        case HevcUnit::NalType::SEI_PREFIX:
            m_hdr->decodeBuffer(nal, nextNal);
            if (m_hdr->deserialize() != 0)
                return rez;
            break;
        case HevcUnit::NalType::DVRPU:
        case HevcUnit::NalType::DVEL:
            if (nal[1] == 1)
            {
                if (nalType == HevcUnit::NalType::DVEL)
                    m_hdr->isDVEL = true;
                else
                    m_hdr->isDVRPU = true;
                V3_flags |= DV;
            }
            break;
        default:
            break;
        }

        // check Frame Depth on first slices
        if (isSlice(nalType) && (nal[2] & 0x80))
        {
            m_slice->decodeBuffer(nal, FFMIN(nal + MAX_SLICE_HEADER, nextNal));
            if (m_slice->deserialize(m_sps, m_pps))
                return rez;  // not enough buffer or error
            m_fullPicOrder = toFullPicOrder(m_slice, m_sps->log2_max_pic_order_cnt_lsb);
            incTimings();
        }
    }
    m_totalFrameNum = m_frameNum = m_fullPicOrder = 0;
    m_curDts = m_curPts = 0;

    // Set HDR10 flag if PQ detected
    if (m_vps && m_sps && m_pps && m_sps->vps_id == m_vps->vps_id && m_pps->sps_id == m_sps->sps_id)
    {
        if (m_sps->colour_primaries == 9 && m_sps->transfer_characteristics == 16 &&
            m_sps->matrix_coeffs == 9)  // SMPTE.ST.2084 (PQ)
        {
            m_hdr->isHDR10 = true;
            V3_flags |= HDR10;
        }

        rez.codecInfo = hevcCodecInfo;
        rez.streamDescr = m_sps->getDescription();
        const size_t frSpsPos = rez.streamDescr.find("Frame rate: not found");
        if (frSpsPos != string::npos)
            rez.streamDescr = rez.streamDescr.substr(0, frSpsPos) + string(" ") + m_vps->getDescription();
    }

    return rez;
}